

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_request_method_parsing_invalid04_Test::TestBody
          (http_request_method_parsing_invalid04_Test *this)

{
  bool bVar1;
  AssertHelper local_58;
  Message local_50 [2];
  http_parsing_error *anon_var_0;
  byte local_29;
  char *pcStack_28;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  sub_string str;
  http_request_method_parsing_invalid04_Test *this_local;
  
  _gtest_msg = sub_string::literal<7ul>((char (*) [7])"OPTION");
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffd8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffd8);
  if (bVar1) {
    local_29 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      parse_request_method((sub_string *)&gtest_msg);
    }
    if ((local_29 & 1) != 0) {
      return;
    }
    pcStack_28 = 
    "Expected: parse_request_method(str) throws an exception of type http_parsing_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_50);
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
             ,0x39,pcStack_28);
  testing::internal::AssertHelper::operator=(&local_58,local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  testing::Message::~Message(local_50);
  return;
}

Assistant:

TEST(http_request_method_parsing, invalid04)
{
    sub_string str = sub_string::literal("OPTION");
    EXPECT_THROW(parse_request_method(str), http_parsing_error);
}